

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O3

void __thiscall String::~String(String *this)

{
  usize *puVar1;
  
  if (this->data->ref != 0) {
    LOCK();
    puVar1 = &this->data->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (this->data != (Data *)0x0)) {
      operator_delete__(this->data);
      return;
    }
  }
  return;
}

Assistant:

~String()
  {
    if(data->ref && Atomic::decrement(data->ref) == 0)
      delete[] (char*)data;
  }